

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_img_format(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  long lVar1;
  aom_codec_err_t aVar2;
  undefined8 *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar4 = args->gp_offset;
  if ((ulong)uVar4 < 0x29) {
    puVar3 = (undefined8 *)((ulong)uVar4 + (long)args->reg_save_area);
    args->gp_offset = uVar4 + 8;
  }
  else {
    puVar3 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar3 + 1;
  }
  if ((int *)*puVar3 == (int *)0x0) {
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      lVar1 = *(long *)(*ctx->frame_worker->data1 + 0x9be8);
      iVar5 = *(int *)(lVar1 + 100);
      if (iVar5 == 0 && *(uint *)(lVar1 + 0x60) == 0) {
        iVar6 = 0x106;
      }
      else {
        uVar4 = *(uint *)(lVar1 + 0x60) ^ 1;
        iVar6 = 0x105;
        if (uVar4 != 0 || iVar5 != 0) {
          iVar6 = 0x102;
          if (uVar4 != 0 || iVar5 != 1) {
            iVar6 = 0;
          }
        }
      }
      iVar5 = iVar6 + 0x800;
      if (*(char *)(lVar1 + 0x4c) == '\0') {
        iVar5 = iVar6;
      }
      *(int *)*puVar3 = iVar5;
      return AOM_CODEC_OK;
    }
    aVar2 = AOM_CODEC_ERROR;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_get_img_format(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_img_fmt_t *const img_fmt = va_arg(args, aom_img_fmt_t *);
  AVxWorker *const worker = ctx->frame_worker;

  if (img_fmt) {
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;

      *img_fmt = get_img_format(cm->seq_params->subsampling_x,
                                cm->seq_params->subsampling_y,
                                cm->seq_params->use_highbitdepth);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}